

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O3

int xar_read_header(archive_read *a,archive_entry *entry)

{
  uint uVar1;
  long *plVar2;
  undefined8 *puVar3;
  xar_file *file;
  ulong uVar4;
  ulong uVar5;
  undefined8 uVar6;
  size_t sVar7;
  wchar_t wVar8;
  int iVar9;
  uchar *p;
  archive_string_conv *paVar10;
  uint *puVar11;
  int *piVar12;
  void *a_sum_val;
  ushort uVar13;
  char *pcVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long *plVar18;
  long *__ptr;
  int iVar19;
  ulong uVar20;
  long *plVar21;
  xattr *pxVar22;
  long lVar23;
  long lVar24;
  void *d;
  size_t outbytes;
  size_t used;
  void *local_58;
  size_t local_50;
  long local_48;
  archive_string *local_40;
  size_t local_38;
  
  plVar2 = (long *)a->format->data;
  if (*plVar2 != 0) goto LAB_001350a5;
  plVar21 = plVar2;
  if (plVar2[0x4a] == 0) {
    paVar10 = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    plVar2[0x4a] = (long)paVar10;
    if (paVar10 == (archive_string_conv *)0x0) {
      return -0x1e;
    }
    plVar21 = (long *)a->format->data;
  }
  puVar11 = (uint *)__archive_read_ahead(a,0x1c,(ssize_t *)&local_58);
  if ((long)local_58 < 0) {
LAB_00135829:
    if ((int)local_58 != 0) {
      return (int)local_58;
    }
    goto LAB_001350a5;
  }
  if (local_58 < (void *)0x1c) {
    pcVar14 = "Truncated archive header";
  }
  else {
    uVar17 = *puVar11;
    if ((uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18) ==
        0x78617221) {
      uVar13 = *(ushort *)((long)puVar11 + 6) << 8 | *(ushort *)((long)puVar11 + 6) >> 8;
      if (uVar13 != 1) {
        archive_set_error(&a->archive,0x54,"Unsupported header version(%d)",(ulong)uVar13);
        return -0x1e;
      }
      uVar4 = *(ulong *)(puVar11 + 2);
      plVar21[8] = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 |
                   (uVar4 & 0xff0000000000) >> 0x18 | (uVar4 & 0xff00000000) >> 8 |
                   (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 | (uVar4 & 0xff00) << 0x28
                   | uVar4 << 0x38;
      uVar4 = *(ulong *)(puVar11 + 4);
      uVar17 = puVar11[6];
      __archive_read_consume(a,0x1c);
      *plVar21 = *plVar21 + 0x1c;
      plVar21[9] = 0;
      iVar19 = move_reading_point(a,0x1c);
      if (iVar19 != 0) {
        return iVar19;
      }
      uVar17 = uVar17 >> 0x18 | (uVar17 & 0xff0000) >> 8 | (uVar17 & 0xff00) << 8 | uVar17 << 0x18;
      iVar19 = rd_contents_init(a,GZIP,uVar17,0);
      if (iVar19 != 0) {
        return iVar19;
      }
      iVar19 = xml2_read_toc(a);
      if (iVar19 != 0) {
        return iVar19;
      }
      plVar21[2] = *plVar21;
      if (plVar21[9] !=
          (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38)) {
        pcVar14 = "TOC uncompressed size error";
        iVar19 = -1;
        goto LAB_001354ee;
      }
      if (uVar17 != 0) {
        iVar19 = move_reading_point(a,plVar21[10]);
        if (iVar19 != 0) {
          return iVar19;
        }
        a_sum_val = __archive_read_ahead(a,plVar21[0xb],(ssize_t *)&local_58);
        if ((long)local_58 < 0) goto LAB_00135829;
        if (local_58 < (void *)plVar21[0xb]) {
          pcVar14 = "Truncated archive file";
          goto LAB_00135375;
        }
        iVar19 = checksum_final(a,a_sum_val,(size_t)plVar21[0xb],(void *)0x0,0);
        __archive_read_consume(a,plVar21[0xb]);
        *plVar21 = *plVar21 + plVar21[0xb];
        if (iVar19 != 0) {
          return -0x1e;
        }
      }
      lVar23 = plVar21[0x38];
      if (lVar23 != 0) {
        __ptr = plVar21 + 0x39;
LAB_00135887:
        do {
          plVar18 = __ptr;
          __ptr = (long *)*plVar18;
          if (__ptr != (long *)0x0) {
            if (*(ulong *)(lVar23 + 0x20) != (ulong)*(uint *)(__ptr + 1)) goto LAB_00135887;
            iVar19 = *(int *)((long)__ptr + 0xc) + 1;
            *(int *)(lVar23 + 0x164) = iVar19;
            lVar24 = __ptr[2];
            if (lVar24 != 0) {
              local_40 = (archive_string *)(lVar23 + 0x98);
              local_48 = lVar23;
              do {
                *(int *)(lVar24 + 0x164) = iVar19;
                *(undefined8 *)(lVar24 + 0x170) = 0;
                archive_string_concat((archive_string *)(lVar24 + 0x168),local_40);
                lVar24 = *(long *)(lVar24 + 8);
              } while (lVar24 != 0);
              __ptr = (long *)*plVar18;
              lVar23 = local_48;
            }
            *plVar18 = *__ptr;
            free(__ptr);
          }
          lVar23 = *(long *)(lVar23 + 8);
          __ptr = plVar21 + 0x39;
        } while (lVar23 != 0);
      }
      (a->archive).archive_format = 0xa0000;
      (a->archive).archive_format_name = "xar";
LAB_001350a5:
      uVar17 = *(uint *)((long)plVar2 + 0x1bc);
      do {
        if ((int)uVar17 < 1) {
          plVar2[0x34] = 0;
LAB_001351ae:
          *(undefined4 *)(plVar2 + 3) = 1;
          return 1;
        }
        puVar3 = (undefined8 *)plVar2[0x36];
        file = (xar_file *)*puVar3;
        uVar1 = uVar17 - 1;
        *(uint *)((long)plVar2 + 0x1bc) = uVar1;
        *puVar3 = puVar3[uVar1];
        if (2 < uVar17) {
          uVar4 = *(ulong *)(*(long *)plVar2[0x36] + 0x20);
          iVar19 = 0;
          iVar16 = 1;
          iVar9 = 0;
          do {
            lVar23 = plVar2[0x36];
            uVar20 = *(ulong *)(*(long *)(lVar23 + (long)iVar16 * 8) + 0x20);
            iVar19 = iVar19 + 2;
            iVar15 = iVar16;
            if ((iVar19 < (int)uVar1) &&
               (uVar5 = *(ulong *)(*(long *)(lVar23 + (long)iVar19 * 8) + 0x20), uVar5 < uVar20)) {
              uVar20 = uVar5;
              iVar15 = iVar19;
            }
            if (uVar4 <= uVar20) break;
            uVar6 = *(undefined8 *)(lVar23 + (long)iVar9 * 8);
            *(undefined8 *)(lVar23 + (long)iVar9 * 8) = *(undefined8 *)(lVar23 + (long)iVar15 * 8);
            *(undefined8 *)(plVar2[0x36] + (long)iVar15 * 8) = uVar6;
            iVar16 = iVar15 * 2 + 1;
            iVar19 = iVar15 * 2;
            iVar9 = iVar15;
          } while (iVar16 < (int)uVar1);
        }
        plVar2[0x34] = (long)file;
        if (file == (xar_file *)0x0) goto LAB_001351ae;
        uVar17 = file->has;
        if (((file->mode & 0xf000) != 0x4000) || (uVar17 != 0x82)) {
          if ((uVar17 >> 0x11 & 1) != 0) {
            archive_entry_set_atime(entry,file->atime,0);
            uVar17 = file->has;
          }
          if ((short)uVar17 < 0) {
            archive_entry_set_ctime(entry,file->ctime,0);
            uVar17 = file->has;
          }
          if ((uVar17 >> 0x10 & 1) != 0) {
            archive_entry_set_mtime(entry,file->mtime,0);
          }
          archive_entry_set_gid(entry,file->gid);
          sVar7 = (file->gname).length;
          iVar19 = 0;
          if ((sVar7 != 0) &&
             (wVar8 = _archive_entry_copy_gname_l
                                (entry,(file->gname).s,sVar7,(archive_string_conv *)plVar2[0x4a]),
             wVar8 != L'\0')) {
            piVar12 = __errno_location();
            if (*piVar12 != 0xc) {
              pcVar14 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
              archive_set_error(&a->archive,0x54,
                                "Gname cannot be converted from %s to current locale.",pcVar14);
              iVar19 = -0x14;
              goto LAB_001353ad;
            }
            pcVar14 = "Can\'t allocate memory for Gname";
LAB_001354e6:
            iVar19 = 0xc;
            goto LAB_001354ee;
          }
LAB_001353ad:
          archive_entry_set_uid(entry,file->uid);
          sVar7 = (file->uname).length;
          if ((sVar7 != 0) &&
             (wVar8 = _archive_entry_copy_uname_l
                                (entry,(file->uname).s,sVar7,(archive_string_conv *)plVar2[0x4a]),
             wVar8 != L'\0')) {
            piVar12 = __errno_location();
            if (*piVar12 == 0xc) {
              pcVar14 = "Can\'t allocate memory for Uname";
              goto LAB_001354e6;
            }
            pcVar14 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
            archive_set_error(&a->archive,0x54,
                              "Uname cannot be converted from %s to current locale.",pcVar14);
            iVar19 = -0x14;
          }
          archive_entry_set_mode(entry,file->mode);
          wVar8 = _archive_entry_copy_pathname_l
                            (entry,(file->pathname).s,(file->pathname).length,
                             (archive_string_conv *)plVar2[0x4a]);
          if (wVar8 != L'\0') {
            piVar12 = __errno_location();
            if (*piVar12 == 0xc) {
              pcVar14 = "Can\'t allocate memory for Pathname";
              goto LAB_001354e6;
            }
            pcVar14 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
            archive_set_error(&a->archive,0x54,
                              "Pathname cannot be converted from %s to current locale.",pcVar14);
            iVar19 = -0x14;
          }
          sVar7 = (file->symlink).length;
          if ((sVar7 != 0) &&
             (wVar8 = _archive_entry_copy_symlink_l
                                (entry,(file->symlink).s,sVar7,(archive_string_conv *)plVar2[0x4a]),
             wVar8 != L'\0')) {
            piVar12 = __errno_location();
            if (*piVar12 == 0xc) {
              pcVar14 = "Can\'t allocate memory for Linkname";
              goto LAB_001354e6;
            }
            pcVar14 = archive_string_conversion_charset_name((archive_string_conv *)plVar2[0x4a]);
            archive_set_error(&a->archive,0x54,
                              "Linkname cannot be converted from %s to current locale.",pcVar14);
            iVar19 = -0x14;
          }
          if ((file->mode & 0xf000) == 0x4000) {
            uVar17 = file->subdirs + 2;
          }
          else {
            uVar17 = file->nlink;
          }
          archive_entry_set_nlink(entry,uVar17);
          archive_entry_set_size(entry,file->size);
          if ((file->hardlink).length != 0) {
            archive_entry_set_hardlink(entry,(file->hardlink).s);
          }
          archive_entry_set_ino64(entry,file->ino64);
          uVar17 = file->has;
          if ((uVar17 >> 8 & 1) != 0) {
            archive_entry_set_dev(entry,file->dev);
            uVar17 = file->has;
          }
          if ((uVar17 >> 9 & 1) != 0) {
            archive_entry_set_devmajor(entry,file->devmajor);
            uVar17 = file->has;
          }
          if ((uVar17 >> 10 & 1) != 0) {
            archive_entry_set_devminor(entry,file->devminor);
          }
          if ((file->fflags_text).length != 0) {
            archive_entry_copy_fflags_text(entry,(file->fflags_text).s);
          }
          *(undefined4 *)(plVar2 + 0x3a) = 1;
          plVar2[0x3b] = 0;
          plVar2[0x3c] = file->length;
          plVar2[0x3e] = file->size;
          *(enctype *)(plVar2 + 0x3f) = file->encoding;
          plVar2[0x44] = *(long *)((file->a_sum).val + 0x10);
          lVar23 = *(long *)&file->a_sum;
          sVar7 = (file->a_sum).len;
          lVar24 = *(long *)((file->a_sum).val + 8);
          plVar2[0x42] = *(long *)(file->a_sum).val;
          plVar2[0x43] = lVar24;
          plVar2[0x40] = lVar23;
          plVar2[0x41] = sVar7;
          plVar2[0x49] = *(long *)((file->e_sum).val + 0x10);
          lVar23 = *(long *)&file->e_sum;
          sVar7 = (file->e_sum).len;
          lVar24 = *(long *)((file->e_sum).val + 8);
          plVar2[0x47] = *(long *)(file->e_sum).val;
          plVar2[0x48] = lVar24;
          plVar2[0x45] = lVar23;
          plVar2[0x46] = sVar7;
          pxVar22 = file->xattr_list;
          if (pxVar22 != (xattr *)0x0) goto LAB_00135691;
          if (iVar19 != 0) goto LAB_001357a1;
          goto LAB_00135753;
        }
        file_free(file);
        uVar17 = *(uint *)((long)plVar2 + 0x1bc);
      } while( true );
    }
    pcVar14 = "Invalid header magic";
  }
LAB_00135375:
  iVar19 = 0x54;
LAB_001354ee:
  archive_set_error(&a->archive,iVar19,pcVar14);
  return -0x1e;
LAB_00135691:
  local_50 = 0;
  local_38 = 0;
  iVar19 = move_reading_point(a,pxVar22->offset);
  if ((iVar19 != 0) ||
     (iVar19 = rd_contents_init(a,pxVar22->encoding,(pxVar22->a_sum).alg,(pxVar22->e_sum).alg),
     iVar19 != 0)) goto LAB_001357a1;
  local_58 = (void *)0x0;
  iVar19 = rd_contents(a,&local_58,&local_50,&local_38,pxVar22->length);
  sVar7 = local_50;
  if (iVar19 != 0) goto LAB_001357a1;
  if (local_50 != pxVar22->size) {
    iVar19 = -0x1e;
    pcVar14 = "Decompressed size error";
LAB_0013578d:
    archive_set_error(&a->archive,-1,pcVar14);
    goto LAB_001357a1;
  }
  iVar9 = checksum_final(a,(pxVar22->a_sum).val,(pxVar22->a_sum).len,(pxVar22->e_sum).val,
                         (pxVar22->e_sum).len);
  iVar19 = -0x14;
  if (iVar9 != 0) {
    pcVar14 = "Xattr checksum error";
    goto LAB_0013578d;
  }
  pcVar14 = (pxVar22->name).s;
  if (pcVar14 == (char *)0x0) {
    pcVar14 = "Xattr name error";
    goto LAB_0013578d;
  }
  archive_entry_xattr_add_entry(entry,pcVar14,local_58,sVar7);
  pxVar22 = pxVar22->next;
  if (pxVar22 == (xattr *)0x0) {
LAB_00135753:
    if (plVar2[0x3c] == 0) {
      iVar19 = 0;
    }
    else {
      iVar19 = move_reading_point(a,file->offset);
    }
LAB_001357a1:
    file_free(file);
    return iVar19;
  }
  goto LAB_00135691;
}

Assistant:

static int
xar_read_header(struct archive_read *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct xar_file *file;
	struct xattr *xattr;
	int r;

	xar = (struct xar *)(a->format->data);
	r = ARCHIVE_OK;

	if (xar->offset == 0) {
		/* Create a character conversion object. */
		if (xar->sconv == NULL) {
			xar->sconv = archive_string_conversion_from_charset(
			    &(a->archive), "UTF-8", 1);
			if (xar->sconv == NULL)
				return (ARCHIVE_FATAL);
		}

		/* Read TOC. */
		r = read_toc(a);
		if (r != ARCHIVE_OK)
			return (r);
	}

	for (;;) {
		file = xar->file = heap_get_entry(&(xar->file_queue));
		if (file == NULL) {
			xar->end_of_file = 1;
			return (ARCHIVE_EOF);
		}
		if ((file->mode & AE_IFMT) != AE_IFDIR)
			break;
		if (file->has != (HAS_PATHNAME | HAS_TYPE))
			break;
		/*
		 * If a file type is a directory and it does not have
		 * any metadata, do not export.
		 */
		file_free(file);
	}
        if (file->has & HAS_ATIME) {
          archive_entry_set_atime(entry, file->atime, 0);
        }
        if (file->has & HAS_CTIME) {
          archive_entry_set_ctime(entry, file->ctime, 0);
        }
        if (file->has & HAS_MTIME) {
          archive_entry_set_mtime(entry, file->mtime, 0);
        }
	archive_entry_set_gid(entry, file->gid);
	if (file->gname.length > 0 &&
	    archive_entry_copy_gname_l(entry, file->gname.s,
		archive_strlen(&(file->gname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Gname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_uid(entry, file->uid);
	if (file->uname.length > 0 &&
	    archive_entry_copy_uname_l(entry, file->uname.s,
		archive_strlen(&(file->uname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Uname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	archive_entry_set_mode(entry, file->mode);
	if (archive_entry_copy_pathname_l(entry, file->pathname.s,
	    archive_strlen(&(file->pathname)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Pathname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}


	if (file->symlink.length > 0 &&
	    archive_entry_copy_symlink_l(entry, file->symlink.s,
		archive_strlen(&(file->symlink)), xar->sconv) != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			return (ARCHIVE_FATAL);
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Linkname cannot be converted from %s to current locale.",
		    archive_string_conversion_charset_name(xar->sconv));
		r = ARCHIVE_WARN;
	}
	/* Set proper nlink. */
	if ((file->mode & AE_IFMT) == AE_IFDIR)
		archive_entry_set_nlink(entry, file->subdirs + 2);
	else
		archive_entry_set_nlink(entry, file->nlink);
	archive_entry_set_size(entry, file->size);
	if (archive_strlen(&(file->hardlink)) > 0)
		archive_entry_set_hardlink(entry, file->hardlink.s);
	archive_entry_set_ino64(entry, file->ino64);
	if (file->has & HAS_DEV)
		archive_entry_set_dev(entry, file->dev);
	if (file->has & HAS_DEVMAJOR)
		archive_entry_set_devmajor(entry, file->devmajor);
	if (file->has & HAS_DEVMINOR)
		archive_entry_set_devminor(entry, file->devminor);
	if (archive_strlen(&(file->fflags_text)) > 0)
		archive_entry_copy_fflags_text(entry, file->fflags_text.s);

	xar->entry_init = 1;
	xar->entry_total = 0;
	xar->entry_remaining = file->length;
	xar->entry_size = file->size;
	xar->entry_encoding = file->encoding;
	xar->entry_a_sum = file->a_sum;
	xar->entry_e_sum = file->e_sum;
	/*
	 * Read extended attributes.
	 */
	xattr = file->xattr_list;
	while (xattr != NULL) {
		const void *d;
		size_t outbytes = 0;
		size_t used = 0;

		r = move_reading_point(a, xattr->offset);
		if (r != ARCHIVE_OK)
			break;
		r = rd_contents_init(a, xattr->encoding,
		    xattr->a_sum.alg, xattr->e_sum.alg);
		if (r != ARCHIVE_OK)
			break;
		d = NULL;
		r = rd_contents(a, &d, &outbytes, &used, xattr->length);
		if (r != ARCHIVE_OK)
			break;
		if (outbytes != xattr->size) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Decompressed size error");
			r = ARCHIVE_FATAL;
			break;
		}
		r = checksum_final(a,
		    xattr->a_sum.val, xattr->a_sum.len,
		    xattr->e_sum.val, xattr->e_sum.len);
		if (r != ARCHIVE_OK) {
#ifndef DONT_FAIL_ON_CRC_ERROR
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr checksum error");
			r = ARCHIVE_WARN;
			break;
#endif
		}
		if (xattr->name.s == NULL) {
			archive_set_error(&(a->archive), ARCHIVE_ERRNO_MISC,
			    "Xattr name error");
			r = ARCHIVE_WARN;
			break;
		}
		archive_entry_xattr_add_entry(entry,
		    xattr->name.s, d, outbytes);
		xattr = xattr->next;
	}
	if (r != ARCHIVE_OK) {
		file_free(file);
		return (r);
	}

	if (xar->entry_remaining > 0)
		/* Move reading point to the beginning of current
		 * file contents. */
		r = move_reading_point(a, file->offset);
	else
		r = ARCHIVE_OK;

	file_free(file);
	return (r);
}